

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BayesianGameBase.h
# Opt level: O1

vector<unsigned_int,_std::allocator<unsigned_int>_> * __thiscall
BayesianGameBase::JointToIndividualTypeIndices(BayesianGameBase *this,Index jTypeI)

{
  long lVar1;
  mapped_type *pmVar2;
  vector<unsigned_int,_std::allocator<unsigned_int>_> *pvVar3;
  long lVar4;
  long lVar5;
  undefined4 in_register_00000034;
  bool bVar6;
  Index local_2c;
  void *local_28 [2];
  long local_18;
  
  local_2c = jTypeI;
  if (this[8] == (BayesianGameBase)0x1) {
    lVar1 = *(long *)(this + 0x68) + 8;
    lVar4 = lVar1;
    for (lVar5 = *(long *)(*(long *)(this + 0x68) + 0x10); lVar5 != 0;
        lVar5 = *(long *)(lVar5 + 0x10 + (ulong)bVar6 * 8)) {
      bVar6 = *(uint *)(lVar5 + 0x20) < jTypeI;
      if (!bVar6) {
        lVar4 = lVar5;
      }
    }
    lVar5 = lVar1;
    if ((lVar4 != lVar1) && (lVar5 = lVar4, jTypeI < *(uint *)(lVar4 + 0x20))) {
      lVar5 = lVar1;
    }
    if (lVar5 == lVar1) {
      IndexTools::JointToIndividualIndices
                ((uint)local_28,(vector *)CONCAT44(in_register_00000034,jTypeI));
      pmVar2 = std::
               map<unsigned_int,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::less<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>_>
               ::operator[](*(map<unsigned_int,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::less<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>_>
                              **)(this + 0x68),&local_2c);
      std::vector<unsigned_int,_std::allocator<unsigned_int>_>::_M_move_assign(pmVar2,local_28);
      if (local_28[0] != (void *)0x0) {
        operator_delete(local_28[0],local_18 - (long)local_28[0]);
      }
    }
    pvVar3 = std::
             map<unsigned_int,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::less<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>_>
             ::operator[](*(map<unsigned_int,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::less<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>_>
                            **)(this + 0x68),&local_2c);
  }
  else {
    if (*(long *)(**(long **)(this + 0x60) + 8 + (ulong)jTypeI * 0x18) ==
        *(long *)(**(long **)(this + 0x60) + (ulong)jTypeI * 0x18)) {
      IndexTools::JointToIndividualIndices
                ((uint)local_28,(vector *)CONCAT44(in_register_00000034,jTypeI));
      std::vector<unsigned_int,_std::allocator<unsigned_int>_>::_M_move_assign
                ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)
                 ((ulong)local_2c * 0x18 + **(long **)(this + 0x60)),local_28);
      if (local_28[0] != (void *)0x0) {
        operator_delete(local_28[0],local_18 - (long)local_28[0]);
      }
    }
    pvVar3 = (vector<unsigned_int,_std::allocator<unsigned_int>_> *)
             ((ulong)local_2c * 0x18 + **(long **)(this + 0x60));
  }
  return pvVar3;
}

Assistant:

const std::vector<Index>& JointToIndividualTypeIndices(Index jTypeI) const
        {
            if(_m_useSparse)
            {
                if((*_m_jointToIndTypesMap).find(jTypeI)==
                   (*_m_jointToIndTypesMap).end())
                    (*_m_jointToIndTypesMap)[jTypeI]=
                        IndexTools::JointToIndividualIndices(
                            jTypeI, _m_nrTypes);
                return((*_m_jointToIndTypesMap)[jTypeI]);
                    
            }
            else
            {
                if((*_m_jointToIndTypes)[jTypeI].size()==0)
                    (*_m_jointToIndTypes)[jTypeI]=
                        IndexTools::JointToIndividualIndices(
                            jTypeI, _m_nrTypes);
                return((*_m_jointToIndTypes)[jTypeI]);
            }
        }